

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fread.c
# Opt level: O1

size_t fread(void *__ptr,size_t __size,size_t __n,FILE *__stream)

{
  char **mtx;
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  size_t local_38;
  
  mtx = &__stream->_IO_save_base;
  mtx_lock((mtx_t *)mtx);
  iVar1 = _PDCLIB_prepread((_PDCLIB_file_t *)__stream);
  if (__n == 0 || iVar1 == -1) {
    __n = 0;
  }
  else {
    sVar3 = 0;
    do {
      bVar5 = __size != 0;
      if (__size != 0) {
        uVar4 = 1;
        do {
          if (((__stream->_IO_read_base == __stream->_IO_write_base) &&
              (__stream->_IO_buf_base == (char *)0x0)) &&
             (iVar1 = _PDCLIB_fillbuffer((_PDCLIB_file_t *)__stream), iVar1 == -1)) {
            mtx_unlock((mtx_t *)mtx);
            local_38 = sVar3;
            break;
          }
          pcVar2 = __stream->_IO_buf_base;
          if (pcVar2 == (char *)0x0) {
            pcVar2 = __stream->_IO_read_base;
            __stream->_IO_read_base = pcVar2 + 1;
            pcVar2 = pcVar2 + (long)__stream->_IO_read_ptr;
          }
          else {
            __stream->_IO_buf_base = pcVar2 + -1;
            pcVar2 = pcVar2 + (long)__stream + 0x3f;
          }
          *(char *)((long)__ptr + (uVar4 - 1)) = *pcVar2;
          bVar5 = uVar4 < __size;
          bVar6 = uVar4 != __size;
          uVar4 = uVar4 + 1;
        } while (bVar6);
      }
      if (bVar5) {
        return local_38;
      }
      sVar3 = sVar3 + 1;
      __ptr = (void *)((long)__ptr + __size);
    } while (sVar3 != __n);
  }
  mtx_unlock((mtx_t *)mtx);
  return __n;
}

Assistant:

size_t fread( void * _PDCLIB_restrict ptr, size_t size, size_t nmemb, struct _PDCLIB_file_t * _PDCLIB_restrict stream )
{
    char * dest = ( char * )ptr;
    size_t nmemb_i = 0;

    _PDCLIB_LOCK( stream->mtx );

    if ( _PDCLIB_prepread( stream ) != EOF )
    {
        for ( nmemb_i = 0; nmemb_i < nmemb; ++nmemb_i )
        {
            size_t size_i;

            /* TODO: For better performance, move from stream buffer
               to destination block-wise, not byte-wise.
            */
            for ( size_i = 0; size_i < size; ++size_i )
            {
                if ( _PDCLIB_CHECKBUFFER( stream ) == EOF )
                {
                    /* Could not read requested data */
                    _PDCLIB_UNLOCK( stream->mtx );
                    return nmemb_i;
                }

                dest[ nmemb_i * size + size_i ] = _PDCLIB_GETC( stream );
            }
        }
    }

    _PDCLIB_UNLOCK( stream->mtx );

    return nmemb_i;
}